

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

_Bool flexfloat_nearest_rounding(flexfloat_t *a,int_fast16_t exp)

{
  _Bool _Var1;
  uint_t uVar2;
  long in_RSI;
  flexfloat_t *in_RDI;
  undefined1 local_1;
  
  _Var1 = flexfloat_round_bit(in_RDI,in_RSI);
  if (_Var1) {
    _Var1 = flexfloat_sticky_bit(in_RDI,in_RSI);
    if (_Var1) {
      local_1 = true;
    }
    else if (in_RSI < 1) {
      uVar2 = flexfloat_denorm_frac(in_RDI,in_RSI);
      local_1 = (uVar2 & 1) != 0;
    }
    else {
      uVar2 = flexfloat_frac(in_RDI);
      local_1 = (uVar2 & 1) != 0;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool flexfloat_nearest_rounding(const flexfloat_t *a, int_fast16_t exp)
{
    if (flexfloat_round_bit(a, exp))
        if (flexfloat_sticky_bit(a, exp)) // > ulp/2 away
        {
            return 1;
        }
        else // = ulp/2 away, round towards even result, decided by LSB of mantissa
        {
            if (exp <= 0) // denormal
                return flexfloat_denorm_frac(a, exp) & 0x1;
            return flexfloat_frac(a) & 0x1;
        }
    return 0; // < ulp/2 away
}